

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

void __thiscall VCFilter::addFiles(VCFilter *this,ProStringList *fileList)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileList->super_QList<ProString>).d.size != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      ProString::toQString
                (&local_48,
                 (ProString *)
                 ((long)&(((fileList->super_QList<ProString>).d.ptr)->m_string).d.d + lVar1));
      addFile(this,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x30;
    } while (uVar2 < (ulong)(fileList->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCFilter::addFiles(const ProStringList& fileList)
{
    for (int i = 0; i < fileList.size(); ++i)
        addFile(fileList.at(i).toQString());
}